

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O0

RationalNum * __thiscall RationalNum::operator--(RationalNum *this)

{
  RationalNum local_30;
  RationalNum local_20;
  RationalNum *local_10;
  RationalNum *this_local;
  
  local_10 = this;
  RationalNum(&local_30,1,1);
  local_20 = ::operator-(this,&local_30);
  operator=(this,&local_20);
  return this;
}

Assistant:

RationalNum &RationalNum::operator--() {
    *this = *this - 1ll;
    return *this;
}